

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# easm_lex.c
# Opt level: O0

void easm_push_buffer_state(YY_BUFFER_STATE new_buffer,yyscan_t yyscanner)

{
  yyguts_t *yyg;
  yyscan_t yyscanner_local;
  YY_BUFFER_STATE new_buffer_local;
  
  if (new_buffer != (YY_BUFFER_STATE)0x0) {
    easm_ensure_buffer_stack(yyscanner);
    if ((*(long *)((long)yyscanner + 0x38) != 0) &&
       (*(long *)(*(long *)((long)yyscanner + 0x38) + *(long *)((long)yyscanner + 0x28) * 8) != 0))
    {
      **(undefined1 **)((long)yyscanner + 0x50) = *(undefined1 *)((long)yyscanner + 0x40);
      *(undefined8 *)
       (*(long *)(*(long *)((long)yyscanner + 0x38) + *(long *)((long)yyscanner + 0x28) * 8) + 0x10)
           = *(undefined8 *)((long)yyscanner + 0x50);
      *(undefined4 *)
       (*(long *)(*(long *)((long)yyscanner + 0x38) + *(long *)((long)yyscanner + 0x28) * 8) + 0x1c)
           = *(undefined4 *)((long)yyscanner + 0x44);
    }
    if ((*(long *)((long)yyscanner + 0x38) != 0) &&
       (*(long *)(*(long *)((long)yyscanner + 0x38) + *(long *)((long)yyscanner + 0x28) * 8) != 0))
    {
      *(long *)((long)yyscanner + 0x28) = *(long *)((long)yyscanner + 0x28) + 1;
    }
    *(YY_BUFFER_STATE *)(*(long *)((long)yyscanner + 0x38) + *(long *)((long)yyscanner + 0x28) * 8)
         = new_buffer;
    easm__load_buffer_state(yyscanner);
    *(undefined4 *)((long)yyscanner + 0x60) = 1;
  }
  return;
}

Assistant:

void yypush_buffer_state (YY_BUFFER_STATE new_buffer , yyscan_t yyscanner)
{
    struct yyguts_t * yyg = (struct yyguts_t*)yyscanner;
	if (new_buffer == NULL)
		return;

	yyensure_buffer_stack(yyscanner);

	/* This block is copied from yy_switch_to_buffer. */
	if ( YY_CURRENT_BUFFER )
		{
		/* Flush out information for old buffer. */
		*yyg->yy_c_buf_p = yyg->yy_hold_char;
		YY_CURRENT_BUFFER_LVALUE->yy_buf_pos = yyg->yy_c_buf_p;
		YY_CURRENT_BUFFER_LVALUE->yy_n_chars = yyg->yy_n_chars;
		}

	/* Only push if top exists. Otherwise, replace top. */
	if (YY_CURRENT_BUFFER)
		yyg->yy_buffer_stack_top++;
	YY_CURRENT_BUFFER_LVALUE = new_buffer;

	/* copied from yy_switch_to_buffer. */
	yy_load_buffer_state( yyscanner );
	yyg->yy_did_buffer_switch_on_eof = 1;
}